

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectPoller.cpp
# Opt level: O2

void __thiscall sznet::net::SelectPoller::removeChannel(SelectPoller *this,Channel *channel)

{
  ChannelMap *this_00;
  int iVar1;
  pointer pEVar2;
  Event_t EVar3;
  self *this_01;
  iterator iVar4;
  mapped_type *ppCVar5;
  size_type sVar6;
  pointer pEVar7;
  long lVar8;
  SourceFile file;
  undefined1 local_1008 [8];
  sz_fd channelAtEndFd;
  undefined1 local_38 [12];
  
  Poller::assertInLoopThread(&this->super_Poller);
  if (g_logLevel < 1) {
    Logger::SourceFile::SourceFile<103>
              ((SourceFile *)local_38,
               (char (*) [103])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/SelectPoller.cpp"
              );
    file._12_4_ = 0;
    file.m_data = (char *)local_38._0_8_;
    file.m_size = local_38._8_4_;
    Logger::Logger((Logger *)local_1008,file,0x8e,TRACE,"removeChannel");
    this_01 = LogStream::operator<<((LogStream *)&channelAtEndFd,"fd = ");
    LogStream::operator<<(this_01,channel->m_fd);
    Logger::~Logger((Logger *)local_1008);
  }
  local_1008._0_4_ = channel->m_fd;
  this_00 = &(this->super_Poller).m_channels;
  iVar4 = std::
          _Rb_tree<int,_std::pair<const_int,_sznet::net::Channel_*>,_std::_Select1st<std::pair<const_int,_sznet::net::Channel_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_sznet::net::Channel_*>_>_>
          ::find(&this_00->_M_t,(key_type_conflict *)local_1008);
  if ((_Rb_tree_header *)iVar4._M_node ==
      &(this->super_Poller).m_channels._M_t._M_impl.super__Rb_tree_header) {
    __assert_fail("m_channels.find(channel->fd()) != m_channels.end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/SelectPoller.cpp"
                  ,0x8f,"virtual void sznet::net::SelectPoller::removeChannel(Channel *)");
  }
  local_1008._0_4_ = channel->m_fd;
  ppCVar5 = std::
            map<int,_sznet::net::Channel_*,_std::less<int>,_std::allocator<std::pair<const_int,_sznet::net::Channel_*>_>_>
            ::operator[](this_00,(key_type_conflict *)local_1008);
  if (*ppCVar5 != channel) {
    __assert_fail("m_channels[channel->fd()] == channel",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/SelectPoller.cpp"
                  ,0x90,"virtual void sznet::net::SelectPoller::removeChannel(Channel *)");
  }
  if (channel->m_events == 0) {
    iVar1 = channel->m_index;
    lVar8 = (long)iVar1;
    if ((lVar8 < 0) ||
       (pEVar7 = (this->m_pollfds).
                 super__Vector_base<sznet::net::Channel::Event_t,_std::allocator<sznet::net::Channel::Event_t>_>
                 ._M_impl.super__Vector_impl_data._M_start,
       (int)((ulong)((long)(this->m_pollfds).
                           super__Vector_base<sznet::net::Channel::Event_t,_std::allocator<sznet::net::Channel::Event_t>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar7) >> 3) <= iVar1
       )) {
      __assert_fail("0 <= idx && idx < static_cast<int>(m_pollfds.size())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/SelectPoller.cpp"
                    ,0x93,"virtual void sznet::net::SelectPoller::removeChannel(Channel *)");
    }
    if (pEVar7[lVar8].ev != 0) {
      __assert_fail("event.ev == channel->events()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/SelectPoller.cpp"
                    ,0x95,"virtual void sznet::net::SelectPoller::removeChannel(Channel *)");
    }
    local_1008._0_4_ = channel->m_fd;
    sVar6 = std::
            _Rb_tree<int,_std::pair<const_int,_sznet::net::Channel_*>,_std::_Select1st<std::pair<const_int,_sznet::net::Channel_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_sznet::net::Channel_*>_>_>
            ::erase(&this_00->_M_t,(key_type_conflict *)local_1008);
    if (sVar6 == 1) {
      pEVar7 = (this->m_pollfds).
               super__Vector_base<sznet::net::Channel::Event_t,_std::allocator<sznet::net::Channel::Event_t>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pEVar2 = (this->m_pollfds).
               super__Vector_base<sznet::net::Channel::Event_t,_std::allocator<sznet::net::Channel::Event_t>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (((long)pEVar7 - (long)pEVar2 >> 3) + -1 != lVar8) {
        local_1008._0_4_ = pEVar7[-1].fd;
        EVar3 = pEVar2[lVar8];
        pEVar2[lVar8] = pEVar7[-1];
        pEVar7[-1] = EVar3;
        ppCVar5 = std::
                  map<int,_sznet::net::Channel_*,_std::less<int>,_std::allocator<std::pair<const_int,_sznet::net::Channel_*>_>_>
                  ::operator[](this_00,(key_type_conflict *)local_1008);
        (*ppCVar5)->m_index = iVar1;
        pEVar7 = (this->m_pollfds).
                 super__Vector_base<sznet::net::Channel::Event_t,_std::allocator<sznet::net::Channel::Event_t>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      (this->m_pollfds).
      super__Vector_base<sznet::net::Channel::Event_t,_std::allocator<sznet::net::Channel::Event_t>_>
      ._M_impl.super__Vector_impl_data._M_finish = pEVar7 + -1;
      return;
    }
    __assert_fail("n == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/SelectPoller.cpp"
                  ,0x99,"virtual void sznet::net::SelectPoller::removeChannel(Channel *)");
  }
  __assert_fail("channel->isNoneEvent()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/SelectPoller.cpp"
                ,0x91,"virtual void sznet::net::SelectPoller::removeChannel(Channel *)");
}

Assistant:

void SelectPoller::removeChannel(Channel* channel)
{
	Poller::assertInLoopThread();
	LOG_TRACE << "fd = " << channel->fd();
	assert(m_channels.find(channel->fd()) != m_channels.end());
	assert(m_channels[channel->fd()] == channel);
	assert(channel->isNoneEvent());
	int idx = channel->index();
	assert(0 <= idx && idx < static_cast<int>(m_pollfds.size()));
	const Channel::Event_t& event = m_pollfds[idx];
	assert(event.ev == channel->events());
	(void)event;
	// 移除
	size_t n = m_channels.erase(channel->fd());
	assert(n == 1); 
	(void)n;
	if (implicit_cast<size_t>(idx) == m_pollfds.size() - 1)
	{
		m_pollfds.pop_back();
	}
	else
	{
		auto channelAtEndFd = m_pollfds.back().fd;
		// 不要影响其他channel的下标
		std::iter_swap(m_pollfds.begin() + idx, m_pollfds.end() - 1);
		// 因为交换了位置，所以index发生了变化
		m_channels[channelAtEndFd]->set_index(idx);
		m_pollfds.pop_back();
	}
}